

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

bool __thiscall
MutableS2ShapeIndex::Init(MutableS2ShapeIndex *this,Decoder *decoder,ShapeFactory *shape_factory)

{
  bool bVar1;
  uint num_shape_ids;
  S2CellId SVar2;
  S2ShapeIndexCell *this_00;
  uint uVar3;
  ulong uVar4;
  iterator position;
  uint64 max_edges_version;
  EncodedS2CellIdVector cell_ids;
  value_type local_70;
  EncodedStringVector encoded_cells;
  Decoder decoder_1;
  
  Clear(this);
  bVar1 = Decoder::get_varint64(decoder,&max_edges_version);
  if (bVar1) {
    uVar4 = 0;
    if ((max_edges_version & 3) != 0) goto LAB_001dd041;
    (this->options_).max_edges_per_cell_ = (int)(max_edges_version >> 2);
    num_shape_ids = (*shape_factory->_vptr_ShapeFactory[2])(shape_factory);
    std::
    vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
    ::reserve(&this->shapes_,(ulong)num_shape_ids);
    while (uVar3 = (uint)uVar4, num_shape_ids != uVar3) {
      (*shape_factory->_vptr_ShapeFactory[3])(&cell_ids,shape_factory,uVar4);
      if (cell_ids.deltas_.data_ != (char *)0x0) {
        *(uint *)(cell_ids.deltas_.data_ + 8) = uVar3;
      }
      std::
      vector<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>,std::allocator<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>>>
      ::emplace_back<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>>
                ((vector<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>,std::allocator<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>>>
                  *)&this->shapes_,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&cell_ids);
      if (cell_ids.deltas_.data_ != (char *)0x0) {
        (**(code **)(*(long *)cell_ids.deltas_.data_ + 8))();
      }
      uVar4 = (ulong)(uVar3 + 1);
    }
    bVar1 = s2coding::EncodedS2CellIdVector::Init(&cell_ids,decoder);
    if (bVar1) {
      bVar1 = s2coding::EncodedStringVector::Init(&encoded_cells,decoder);
      uVar4 = 0;
      if (bVar1) {
        while (uVar3 = (uint)uVar4, uVar3 < cell_ids.deltas_.size_) {
          SVar2 = s2coding::EncodedS2CellIdVector::operator[](&cell_ids,uVar3);
          this_00 = (S2ShapeIndexCell *)operator_new(0x10);
          *(undefined8 *)
           &(this_00->shapes_).
            super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> = 0;
          (this_00->shapes_).
          super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>.field_7.pointer_
               = (S2ClippedShape *)0x0;
          s2coding::EncodedStringVector::GetDecoder(&decoder_1,&encoded_cells,uVar3);
          bVar1 = S2ShapeIndexCell::Decode(this_00,num_shape_ids,&decoder_1);
          if (!bVar1) goto LAB_001dd03f;
          position = gtl::internal_btree::
                     btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                     ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                            *)&this->cell_map_);
          local_70.first = SVar2;
          local_70.second = this_00;
          gtl::internal_btree::
          btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
          ::insert((btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
                    *)&this->cell_map_,position,&local_70);
          uVar4 = (ulong)(uVar3 + 1);
        }
        uVar4 = 1;
      }
      goto LAB_001dd041;
    }
  }
LAB_001dd03f:
  uVar4 = 0;
LAB_001dd041:
  return SUB81(uVar4,0);
}

Assistant:

bool MutableS2ShapeIndex::Init(Decoder* decoder,
                               const ShapeFactory& shape_factory) {
  Clear();
  uint64 max_edges_version;
  if (!decoder->get_varint64(&max_edges_version)) return false;
  int version = max_edges_version & 3;
  if (version != kCurrentEncodingVersionNumber) return false;
  options_.set_max_edges_per_cell(max_edges_version >> 2);
  uint32 num_shapes = shape_factory.size();
  shapes_.reserve(num_shapes);
  for (int shape_id = 0; shape_id < num_shapes; ++shape_id) {
    auto shape = shape_factory[shape_id];
    if (shape) shape->id_ = shape_id;
    shapes_.push_back(std::move(shape));
  }

  s2coding::EncodedS2CellIdVector cell_ids;
  s2coding::EncodedStringVector encoded_cells;
  if (!cell_ids.Init(decoder)) return false;
  if (!encoded_cells.Init(decoder)) return false;

  for (int i = 0; i < cell_ids.size(); ++i) {
    S2CellId id = cell_ids[i];
    S2ShapeIndexCell* cell = new S2ShapeIndexCell;
    Decoder decoder = encoded_cells.GetDecoder(i);
    if (!cell->Decode(num_shapes, &decoder)) return false;
    cell_map_.insert(cell_map_.end(), std::make_pair(id, cell));
  }
  return true;
}